

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O2

int Aig_ManAddNewCnfToSolver
              (sat_solver *pSat,Aig_Man_t *pAig,Vec_Int_t *vNode2Var,Vec_Int_t *vPioIds,
              Vec_Ptr_t *vPartPos,int fAlignPol)

{
  lit *begin;
  lit *end;
  Vec_Ptr_t *p;
  Aig_Man_t *pAVar1;
  sat_solver *psVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Cnf_Dat_t *pCVar6;
  void *pvVar7;
  long lVar8;
  int Lits [2];
  int local_6c;
  Cnf_Dat_t *local_68;
  Aig_Man_t *local_60;
  Vec_Int_t *local_58;
  sat_solver *local_50;
  Vec_Int_t *local_48;
  int local_3c;
  Vec_Ptr_t *local_38;
  
  local_48 = vPioIds;
  local_3c = fAlignPol;
  local_38 = vPartPos;
  pCVar6 = Cnf_Derive(pAig,pAig->nObjs[3]);
  Cnf_DataTranformPolarity(pCVar6,1);
  iVar3 = sat_solver_nvars(pSat);
  Cnf_DataLift(pCVar6,iVar3);
  iVar3 = sat_solver_nvars(pSat);
  sat_solver_setnvars(pSat,iVar3 + pCVar6->nVars);
  lVar8 = 0;
  while (lVar8 < pCVar6->nClauses) {
    begin = pCVar6->pClauses[lVar8];
    if ((begin == (lit *)0x0) || (end = pCVar6->pClauses[lVar8 + 1], end == (lit *)0x0)) break;
    iVar3 = sat_solver_addclause(pSat,begin,end);
    lVar8 = lVar8 + 1;
    if (iVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                    ,0x18b,
                    "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                   );
    }
  }
  iVar3 = 0;
  local_68 = pCVar6;
  local_60 = pAig;
  local_58 = vNode2Var;
  local_50 = pSat;
  do {
    if (local_60->vCis->nSize <= iVar3) {
      iVar3 = 0;
      do {
        pAVar1 = local_60;
        if (local_60->vCos->nSize <= iVar3) {
          iVar4 = 0;
          iVar3 = Vec_IntEntry(vNode2Var,0);
          pCVar6 = local_68;
          if (iVar3 == 0) {
            Vec_IntWriteEntry(vNode2Var,0,*local_68->pVarNums);
          }
          Cnf_DataFree(pCVar6);
          psVar2 = local_50;
          while( true ) {
            if (local_38->nSize <= iVar4) {
              iVar3 = 0;
              do {
                p = pAVar1->vCis;
                if (p->nSize <= iVar3) {
                  return 0;
                }
                pvVar7 = Vec_PtrEntry(p,iVar3);
                if ((*(byte *)((long)pvVar7 + 0x18) & 0x30) != 0) {
                  iVar4 = Vec_IntEntry(local_48,iVar3);
                  iVar4 = Vec_IntEntry(vNode2Var,iVar4);
                  Lits[0] = (*(uint *)((long)pvVar7 + 0x18) >> 4 & 1) + iVar4 * 2;
                  iVar4 = sat_solver_addclause(psVar2,Lits,Lits + 1);
                  if (iVar4 == 0) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                                  ,0x1d8,
                                  "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                                 );
                  }
                  *(byte *)((long)pvVar7 + 0x18) = *(byte *)((long)pvVar7 + 0x18) & 0xcf;
                }
                iVar3 = iVar3 + 1;
              } while( true );
            }
            pvVar7 = Vec_PtrEntry(local_38,iVar4);
            iVar3 = -1;
            if (*(ulong *)((long)pvVar7 + 8) != 0) {
              iVar3 = *(int *)((*(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffe) + 0x24);
            }
            iVar3 = Vec_IntEntry(local_58,iVar3);
            if (iVar3 == 0) break;
            Lits[0] = ((uint)*(ulong *)((long)pvVar7 + 8) & 1) + iVar3 * 2;
            if ((local_3c != 0) &&
               ((*(byte *)((*(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffe) + 0x18) & 8) != 0)) {
              Lits[0] = Lits[0] ^ 1;
            }
            iVar3 = sat_solver_addclause(psVar2,Lits,Lits + 1);
            iVar4 = iVar4 + 1;
            vNode2Var = local_58;
            if (iVar3 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                            ,0x1ca,
                            "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                           );
            }
          }
          __assert_fail("iSatVarOld != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                        ,0x1c2,
                        "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                       );
        }
        pvVar7 = Vec_PtrEntry(local_60->vCos,iVar3);
        iVar4 = Vec_IntEntry(local_48,pAVar1->nObjs[2] + iVar3);
        iVar5 = Vec_IntEntry(vNode2Var,iVar4);
        psVar2 = local_50;
        pCVar6 = local_68;
        if (iVar5 == 0) {
          Vec_IntWriteEntry(vNode2Var,iVar4,local_68->pVarNums[*(int *)((long)pvVar7 + 0x24)]);
        }
        else {
          Lits[1] = local_68->pVarNums[*(int *)((long)pvVar7 + 0x24)] * 2 + 1;
          Lits[0] = iVar5 * 2;
          local_6c = iVar3;
          iVar3 = sat_solver_addclause(local_50,Lits,&local_6c);
          if (iVar3 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                          ,0x1b2,
                          "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                         );
          }
          Lits[0] = iVar5 * 2 | 1;
          Lits[1] = pCVar6->pVarNums[*(int *)((long)pvVar7 + 0x24)] * 2;
          iVar4 = sat_solver_addclause(psVar2,Lits,&local_6c);
          vNode2Var = local_58;
          iVar3 = local_6c;
          if (iVar4 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                          ,0x1b6,
                          "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                         );
          }
        }
        iVar3 = iVar3 + 1;
      } while( true );
    }
    pvVar7 = Vec_PtrEntry(local_60->vCis,iVar3);
    iVar4 = Vec_IntEntry(local_48,iVar3);
    iVar5 = Vec_IntEntry(vNode2Var,iVar4);
    psVar2 = local_50;
    pCVar6 = local_68;
    if (iVar5 == 0) {
      Vec_IntWriteEntry(vNode2Var,iVar4,local_68->pVarNums[*(int *)((long)pvVar7 + 0x24)]);
    }
    else {
      Lits[1] = local_68->pVarNums[*(int *)((long)pvVar7 + 0x24)] * 2 + 1;
      Lits[0] = iVar5 * 2;
      local_6c = iVar3;
      iVar3 = sat_solver_addclause(local_50,Lits,&local_6c);
      if (iVar3 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                      ,0x19d,
                      "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                     );
      }
      Lits[0] = iVar5 * 2 | 1;
      Lits[1] = pCVar6->pVarNums[*(int *)((long)pvVar7 + 0x24)] * 2;
      iVar4 = sat_solver_addclause(psVar2,Lits,&local_6c);
      vNode2Var = local_58;
      iVar3 = local_6c;
      if (iVar4 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartSat.c"
                      ,0x1a1,
                      "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                     );
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int Aig_ManAddNewCnfToSolver( sat_solver * pSat, Aig_Man_t * pAig, Vec_Int_t * vNode2Var, 
                             Vec_Int_t * vPioIds, Vec_Ptr_t * vPartPos, int fAlignPol )
{
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int * pBeg, * pEnd;
    int i, Lits[2], iSatVarOld, iNodeIdOld;
    // derive CNF and express it using new SAT variables
    pCnf = Cnf_Derive( pAig, Aig_ManCoNum(pAig) );
    Cnf_DataTranformPolarity( pCnf, 1 );
    Cnf_DataLift( pCnf, sat_solver_nvars(pSat) );
    // create new variables in the SAT solver
    sat_solver_setnvars( pSat, sat_solver_nvars(pSat) + pCnf->nVars );
    // add clauses for this CNF
    Cnf_CnfForClause( pCnf, pBeg, pEnd, i )
        if ( !sat_solver_addclause( pSat, pBeg, pEnd ) )
        {
            assert( 0 ); // if it happens, can return 1 (unsatisfiable)
            return 1;
        }
    // derive the connector clauses
    Aig_ManForEachCi( pAig, pObj, i )
    {
        iNodeIdOld = Vec_IntEntry( vPioIds, i );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        if ( iSatVarOld == 0 ) // iNodeIdOld in the original AIG has no SAT var
        { 
            // map the corresponding original AIG node into this SAT var
            Vec_IntWriteEntry( vNode2Var, iNodeIdOld, pCnf->pVarNums[Aig_ObjId(pObj)] );
            continue;
        }
        // add connector clauses 
        Lits[0] = toLitCond( iSatVarOld, 0 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
        Lits[0] = toLitCond( iSatVarOld, 1 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
    }
    // derive the connector clauses
    Aig_ManForEachCo( pAig, pObj, i )
    {
        iNodeIdOld = Vec_IntEntry( vPioIds, Aig_ManCiNum(pAig) + i );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        if ( iSatVarOld == 0 ) // iNodeIdOld in the original AIG has no SAT var
        { 
            // map the corresponding original AIG node into this SAT var
            Vec_IntWriteEntry( vNode2Var, iNodeIdOld, pCnf->pVarNums[Aig_ObjId(pObj)] );
            continue;
        }
        // add connector clauses 
        Lits[0] = toLitCond( iSatVarOld, 0 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
        Lits[0] = toLitCond( iSatVarOld, 1 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
    }
    // transfer the ID of constant 1 node
    if ( Vec_IntEntry( vNode2Var, 0 ) == 0 )
        Vec_IntWriteEntry( vNode2Var, 0, pCnf->pVarNums[0] );
    // remove the CNF
    Cnf_DataFree( pCnf );
    // constrain the solver with the literals corresponding to the original POs
    Vec_PtrForEachEntry( Aig_Obj_t *, vPartPos, pObj, i )
    {
        iNodeIdOld = Aig_ObjFaninId0( pObj );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        assert( iSatVarOld != 0 );
        // assert the original PO to be 1
        Lits[0] = toLitCond( iSatVarOld, Aig_ObjFaninC0(pObj) );
        // correct the polarity if polarity alignment is enabled
        if ( fAlignPol && Aig_ObjFanin0(pObj)->fPhase ) 
            Lits[0] = lit_neg( Lits[0] );
        if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
        {
            assert( 0 ); // if it happens, can return 1 (unsatisfiable)
            return 1;
        }
    }
    // constrain some the primary inputs to constant values
    Aig_ManForEachCi( pAig, pObj, i )
    {
        if ( !pObj->fMarkA && !pObj->fMarkB )
            continue;
        iNodeIdOld = Vec_IntEntry( vPioIds, i );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        Lits[0] = toLitCond( iSatVarOld, pObj->fMarkA );
        if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
        {
            assert( 0 ); // if it happens, can return 1 (unsatisfiable)
            return 1;
        }
        pObj->fMarkA = pObj->fMarkB = 0;
    }
    return 0;
}